

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

double asl::myatof(char *s)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  byte *__s;
  int iVar9;
  double dVar10;
  
  cVar1 = *s;
  __s = (byte *)(s + (cVar1 == '-'));
  pcVar5 = strchr((char *)__s,0x2e);
  if (pcVar5 == (char *)0x0) {
    iVar9 = 0;
    pbVar6 = (byte *)0x0;
  }
  else {
    for (lVar8 = 0; ((cVar2 = pcVar5[lVar8 + 1], cVar2 != '\0' && (cVar2 != 'E')) && (cVar2 != 'e'))
        ; lVar8 = lVar8 + 1) {
    }
    iVar9 = -(int)lVar8;
    pbVar6 = (byte *)(pcVar5 + lVar8);
  }
  if (pbVar6 == (byte *)0x0) {
    pbVar6 = __s;
  }
  bVar3 = *pbVar6;
  do {
    pbVar7 = pbVar6;
    if (bVar3 == 0) goto LAB_0011b100;
    bVar3 = pbVar7[1];
    pbVar6 = pbVar7 + 1;
  } while ((bVar3 | 0x20) != 0x65);
  iVar4 = myatoiz((char *)(pbVar7 + 1 + (ulong)(pbVar7[2] == 0x2b) + 1));
  iVar9 = iVar4 + iVar9;
LAB_0011b100:
  lVar8 = 0;
  while( true ) {
    do {
      bVar3 = *__s;
      __s = __s + 1;
    } while (bVar3 == 0x2e);
    if ((bVar3 == 0) || ((bVar3 & 0xdf) == 0x45)) break;
    lVar8 = (long)(char)bVar3 + lVar8 * 10 + -0x30;
  }
  dVar10 = pow(10.0,(double)iVar9);
  dVar10 = (double)lVar8 * dVar10;
  if (cVar1 == '-') {
    dVar10 = -dVar10;
  }
  return dVar10;
}

Assistant:

double myatof(const char* s)
{
	double y = 0;
	double m = 1;
	int exp = 0;
	if (s[0] == '-') { m = -1; s++; }
	const char* p = strchr(s, '.');
	if (p) {
		p++;
		while (*p != '\0' && *p != 'e' && *p != 'E') {
			exp--;
			p++;
		}
		p--;
	}
	if (!p) p = s;
	while (*p++)
		if (*p == 'e' || *p == 'E'){
			if (*(p + 1) == '+')
				p++;
			exp += myatoiz(p + 1);
			break;
		}
	long long y1 = 0;
	while (int c = *s++)
	{
		if (c == '.') continue;
		if (c == 'E' || c == 'e') break;
		y1 = 10 * y1 + (c - '0');
	}
	y = double(y1) * pow(10.0, exp);
	return y * m;
}